

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O2

void __thiscall
irr::scene::CSkinnedMesh::getFrameData
          (CSkinnedMesh *this,f32 frame,SJoint *joint,vector3df *position,s32 *positionHint,
          vector3df *scale,s32 *scaleHint,quaternion *rotation,s32 *rotationHint)

{
  quaternion *pqVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  SJoint *pSVar10;
  pointer pSVar11;
  pointer pSVar12;
  pointer pSVar13;
  undefined1 auVar14 [16];
  f32 fVar15;
  f32 fVar16;
  f32 fVar17;
  ulong uVar18;
  pointer pSVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  pointer pSVar23;
  pointer pSVar24;
  ulong uVar25;
  vector3d<float> *pvVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  quaternion q1;
  quaternion q2;
  vector3d<float> vVar32;
  vector3d<float> local_40;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  
  pSVar10 = joint->UseAnimationFrom;
  if (pSVar10 == (SJoint *)0x0) {
    return;
  }
  pSVar11 = (pSVar10->PositionKeys).m_data.
            super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar22 = (ulong)((long)(pSVar10->PositionKeys).m_data.
                         super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar11) >> 4;
  uVar21 = (uint)uVar22;
  if (uVar21 != 0) {
    uVar20 = *positionHint;
    uVar18 = (ulong)uVar20;
    if (((int)uVar20 < 0) || (uVar21 <= uVar20)) {
LAB_001c90ca:
      pSVar23 = pSVar11;
      for (uVar25 = 0; (uVar22 & 0xffffffff) != uVar25; uVar25 = uVar25 + 1) {
        if ((float)frame <= (float)pSVar23->frame) goto LAB_001c9090;
        pSVar23 = pSVar23 + 1;
      }
    }
    else {
      if ((uVar20 == 0) ||
         (((float)pSVar11[uVar18].frame < (float)frame ||
          ((float)frame < (float)pSVar11[uVar18 - 1].frame ||
           (float)frame == (float)pSVar11[uVar18 - 1].frame)))) {
        uVar25 = uVar18 + 1;
        if (((int)uVar21 <= (int)uVar25) ||
           (((float)pSVar11[uVar25].frame < (float)frame ||
            ((float)frame < (float)pSVar11[uVar18].frame ||
             (float)frame == (float)pSVar11[uVar18].frame)))) goto LAB_001c90ca;
LAB_001c9090:
        uVar20 = (uint)uVar25;
        *positionHint = uVar20;
      }
      if (uVar20 == 0 || this->field_0xb5 == '\0') {
        position->Z = pSVar11[uVar20].position.Z;
        fVar31 = pSVar11[uVar20].position.Y;
        position->X = pSVar11[uVar20].position.X;
        position->Y = fVar31;
      }
      else if (this->field_0xb5 == '\x01') {
        pvVar26 = &pSVar11[uVar20].position;
        fVar27 = (float)frame - (float)pSVar11[uVar20].frame;
        fVar31 = (float)pSVar11[uVar20 - 1].frame;
        vVar32 = core::vector3d<float>::operator-(&pSVar11[uVar20 - 1].position,pvVar26);
        auVar28._0_8_ = vVar32._0_8_;
        auVar28._8_8_ = extraout_XMM0_Qb;
        fVar31 = (fVar31 - (float)frame) + fVar27;
        auVar30._4_4_ = fVar31;
        auVar30._0_4_ = fVar31;
        auVar30._8_8_ = 0;
        auVar30 = divps(auVar28,auVar30);
        local_40.Z = (vVar32.Z / fVar31) * fVar27;
        local_40.Y = fVar27 * auVar30._4_4_;
        local_40.X = fVar27 * auVar30._0_4_;
        vVar32 = core::vector3d<float>::operator+(&local_40,pvVar26);
        position->X = vVar32.X;
        position->Y = vVar32.Y;
        position->Z = vVar32.Z;
      }
    }
  }
  pSVar12 = (pSVar10->ScaleKeys).m_data.
            super__Vector_base<irr::scene::ISkinnedMesh::SScaleKey,_std::allocator<irr::scene::ISkinnedMesh::SScaleKey>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar22 = (ulong)((long)(pSVar10->ScaleKeys).m_data.
                         super__Vector_base<irr::scene::ISkinnedMesh::SScaleKey,_std::allocator<irr::scene::ISkinnedMesh::SScaleKey>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar12) >> 4;
  uVar21 = (uint)uVar22;
  if (uVar21 != 0) {
    uVar20 = *scaleHint;
    uVar18 = (ulong)uVar20;
    if (((int)uVar20 < 0) || (uVar21 <= uVar20)) {
LAB_001c9226:
      pSVar19 = pSVar12;
      for (uVar25 = 0; (uVar22 & 0xffffffff) != uVar25; uVar25 = uVar25 + 1) {
        if ((float)frame <= (float)pSVar19->frame) goto LAB_001c91ef;
        pSVar19 = pSVar19 + 1;
      }
    }
    else {
      if ((uVar20 == 0) ||
         (((float)pSVar12[uVar18].frame < (float)frame ||
          ((float)frame < (float)pSVar12[uVar18 - 1].frame ||
           (float)frame == (float)pSVar12[uVar18 - 1].frame)))) {
        uVar25 = uVar18 + 1;
        if (((int)uVar21 <= (int)uVar25) ||
           (((float)pSVar12[uVar25].frame < (float)frame ||
            ((float)frame < (float)pSVar12[uVar18].frame ||
             (float)frame == (float)pSVar12[uVar18].frame)))) goto LAB_001c9226;
LAB_001c91ef:
        uVar20 = (uint)uVar25;
        *scaleHint = uVar20;
      }
      if (uVar20 == 0 || this->field_0xb5 == '\0') {
        scale->Z = pSVar12[uVar20].scale.Z;
        fVar31 = pSVar12[uVar20].scale.Y;
        scale->X = pSVar12[uVar20].scale.X;
        scale->Y = fVar31;
      }
      else if (this->field_0xb5 == '\x01') {
        pvVar26 = &pSVar12[uVar20].scale;
        fVar27 = (float)frame - (float)pSVar12[uVar20].frame;
        fVar31 = (float)pSVar12[uVar20 - 1].frame;
        vVar32 = core::vector3d<float>::operator-(&pSVar12[uVar20 - 1].scale,pvVar26);
        auVar29._0_8_ = vVar32._0_8_;
        auVar29._8_8_ = extraout_XMM0_Qb_00;
        fVar31 = (fVar31 - (float)frame) + fVar27;
        auVar14._4_4_ = fVar31;
        auVar14._0_4_ = fVar31;
        auVar14._8_8_ = 0;
        auVar30 = divps(auVar29,auVar14);
        local_40.Z = (vVar32.Z / fVar31) * fVar27;
        local_40.Y = fVar27 * auVar30._4_4_;
        local_40.X = fVar27 * auVar30._0_4_;
        vVar32 = core::vector3d<float>::operator+(&local_40,pvVar26);
        scale->X = vVar32.X;
        scale->Y = vVar32.Y;
        scale->Z = vVar32.Z;
      }
    }
  }
  pSVar13 = (pSVar10->RotationKeys).m_data.
            super__Vector_base<irr::scene::ISkinnedMesh::SRotationKey,_std::allocator<irr::scene::ISkinnedMesh::SRotationKey>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar22 = ((long)(pSVar10->RotationKeys).m_data.
                  super__Vector_base<irr::scene::ISkinnedMesh::SRotationKey,_std::allocator<irr::scene::ISkinnedMesh::SRotationKey>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar13) / 0x14;
  uVar21 = (uint)uVar22;
  if (uVar21 == 0) {
    return;
  }
  uVar20 = *rotationHint;
  uVar18 = (ulong)uVar20;
  if (((int)uVar20 < 0) || (uVar21 <= uVar20)) {
LAB_001c9382:
    pSVar24 = pSVar13;
    for (uVar25 = 0; (uVar22 & 0xffffffff) != uVar25; uVar25 = uVar25 + 1) {
      if ((float)frame <= (float)pSVar24->frame) goto LAB_001c9350;
      pSVar24 = pSVar24 + 1;
    }
  }
  else {
    if ((uVar20 == 0) ||
       (((float)pSVar13[uVar18].frame < (float)frame ||
        ((float)frame < (float)pSVar13[uVar18 - 1].frame ||
         (float)frame == (float)pSVar13[uVar18 - 1].frame)))) {
      uVar25 = uVar18 + 1;
      if (((int)uVar21 <= (int)uVar25) ||
         (((float)pSVar13[uVar25].frame < (float)frame ||
          ((float)frame < (float)pSVar13[uVar18].frame ||
           (float)frame == (float)pSVar13[uVar18].frame)))) goto LAB_001c9382;
LAB_001c9350:
      uVar20 = (uint)uVar25;
      *rotationHint = uVar20;
    }
    if (uVar20 == 0 || this->field_0xb5 == '\0') {
      pqVar1 = &pSVar13[uVar20].rotation;
      fVar15 = pqVar1->Y;
      fVar16 = pqVar1->Z;
      fVar17 = pqVar1->W;
      rotation->X = pqVar1->X;
      rotation->Y = fVar15;
      rotation->Z = fVar16;
      rotation->W = fVar17;
    }
    else if (this->field_0xb5 == '\x01') {
      uVar21 = uVar20 - 1;
      fVar31 = (float)frame - (float)pSVar13[uVar20].frame;
      uVar2 = pSVar13[uVar20].rotation.X;
      uVar6 = pSVar13[uVar20].rotation.Y;
      q1.Y = (f32)uVar6;
      q1.X = (f32)uVar2;
      uVar3 = pSVar13[uVar20].rotation.Z;
      uVar7 = pSVar13[uVar20].rotation.W;
      q1.W = (f32)uVar7;
      q1.Z = (f32)uVar3;
      uVar4 = pSVar13[uVar21].rotation.X;
      uVar8 = pSVar13[uVar21].rotation.Y;
      q2.Y = (f32)uVar8;
      q2.X = (f32)uVar4;
      uVar5 = pSVar13[uVar21].rotation.Z;
      uVar9 = pSVar13[uVar21].rotation.W;
      q2.W = (f32)uVar9;
      q2.Z = (f32)uVar5;
      core::quaternion::slerp
                (rotation,q1,q2,
                 (f32)(fVar31 / (((float)pSVar13[uVar21].frame - (float)frame) + fVar31)),0.05);
    }
  }
  return;
}

Assistant:

void CSkinnedMesh::getFrameData(f32 frame, SJoint *joint,
		core::vector3df &position, s32 &positionHint,
		core::vector3df &scale, s32 &scaleHint,
		core::quaternion &rotation, s32 &rotationHint)
{
	s32 foundPositionIndex = -1;
	s32 foundScaleIndex = -1;
	s32 foundRotationIndex = -1;

	if (joint->UseAnimationFrom) {
		const core::array<SPositionKey> &PositionKeys = joint->UseAnimationFrom->PositionKeys;
		const core::array<SScaleKey> &ScaleKeys = joint->UseAnimationFrom->ScaleKeys;
		const core::array<SRotationKey> &RotationKeys = joint->UseAnimationFrom->RotationKeys;

		if (PositionKeys.size()) {
			foundPositionIndex = -1;

			// Test the Hints...
			if (positionHint >= 0 && (u32)positionHint < PositionKeys.size()) {
				// check this hint
				if (positionHint > 0 && PositionKeys[positionHint].frame >= frame && PositionKeys[positionHint - 1].frame < frame)
					foundPositionIndex = positionHint;
				else if (positionHint + 1 < (s32)PositionKeys.size()) {
					// check the next index
					if (PositionKeys[positionHint + 1].frame >= frame &&
							PositionKeys[positionHint + 0].frame < frame) {
						positionHint++;
						foundPositionIndex = positionHint;
					}
				}
			}

			// The hint test failed, do a full scan...
			if (foundPositionIndex == -1) {
				for (u32 i = 0; i < PositionKeys.size(); ++i) {
					if (PositionKeys[i].frame >= frame) { // Keys should to be sorted by frame
						foundPositionIndex = i;
						positionHint = i;
						break;
					}
				}
			}

			// Do interpolation...
			if (foundPositionIndex != -1) {
				if (InterpolationMode == EIM_CONSTANT || foundPositionIndex == 0) {
					position = PositionKeys[foundPositionIndex].position;
				} else if (InterpolationMode == EIM_LINEAR) {
					const SPositionKey &KeyA = PositionKeys[foundPositionIndex];
					const SPositionKey &KeyB = PositionKeys[foundPositionIndex - 1];

					const f32 fd1 = frame - KeyA.frame;
					const f32 fd2 = KeyB.frame - frame;
					position = ((KeyB.position - KeyA.position) / (fd1 + fd2)) * fd1 + KeyA.position;
				}
			}
		}

		//------------------------------------------------------------

		if (ScaleKeys.size()) {
			foundScaleIndex = -1;

			// Test the Hints...
			if (scaleHint >= 0 && (u32)scaleHint < ScaleKeys.size()) {
				// check this hint
				if (scaleHint > 0 && ScaleKeys[scaleHint].frame >= frame && ScaleKeys[scaleHint - 1].frame < frame)
					foundScaleIndex = scaleHint;
				else if (scaleHint + 1 < (s32)ScaleKeys.size()) {
					// check the next index
					if (ScaleKeys[scaleHint + 1].frame >= frame &&
							ScaleKeys[scaleHint + 0].frame < frame) {
						scaleHint++;
						foundScaleIndex = scaleHint;
					}
				}
			}

			// The hint test failed, do a full scan...
			if (foundScaleIndex == -1) {
				for (u32 i = 0; i < ScaleKeys.size(); ++i) {
					if (ScaleKeys[i].frame >= frame) { // Keys should to be sorted by frame
						foundScaleIndex = i;
						scaleHint = i;
						break;
					}
				}
			}

			// Do interpolation...
			if (foundScaleIndex != -1) {
				if (InterpolationMode == EIM_CONSTANT || foundScaleIndex == 0) {
					scale = ScaleKeys[foundScaleIndex].scale;
				} else if (InterpolationMode == EIM_LINEAR) {
					const SScaleKey &KeyA = ScaleKeys[foundScaleIndex];
					const SScaleKey &KeyB = ScaleKeys[foundScaleIndex - 1];

					const f32 fd1 = frame - KeyA.frame;
					const f32 fd2 = KeyB.frame - frame;
					scale = ((KeyB.scale - KeyA.scale) / (fd1 + fd2)) * fd1 + KeyA.scale;
				}
			}
		}

		//-------------------------------------------------------------

		if (RotationKeys.size()) {
			foundRotationIndex = -1;

			// Test the Hints...
			if (rotationHint >= 0 && (u32)rotationHint < RotationKeys.size()) {
				// check this hint
				if (rotationHint > 0 && RotationKeys[rotationHint].frame >= frame && RotationKeys[rotationHint - 1].frame < frame)
					foundRotationIndex = rotationHint;
				else if (rotationHint + 1 < (s32)RotationKeys.size()) {
					// check the next index
					if (RotationKeys[rotationHint + 1].frame >= frame &&
							RotationKeys[rotationHint + 0].frame < frame) {
						rotationHint++;
						foundRotationIndex = rotationHint;
					}
				}
			}

			// The hint test failed, do a full scan...
			if (foundRotationIndex == -1) {
				for (u32 i = 0; i < RotationKeys.size(); ++i) {
					if (RotationKeys[i].frame >= frame) { // Keys should be sorted by frame
						foundRotationIndex = i;
						rotationHint = i;
						break;
					}
				}
			}

			// Do interpolation...
			if (foundRotationIndex != -1) {
				if (InterpolationMode == EIM_CONSTANT || foundRotationIndex == 0) {
					rotation = RotationKeys[foundRotationIndex].rotation;
				} else if (InterpolationMode == EIM_LINEAR) {
					const SRotationKey &KeyA = RotationKeys[foundRotationIndex];
					const SRotationKey &KeyB = RotationKeys[foundRotationIndex - 1];

					const f32 fd1 = frame - KeyA.frame;
					const f32 fd2 = KeyB.frame - frame;
					const f32 t = fd1 / (fd1 + fd2);

					/*
					f32 t = 0;
					if (KeyA.frame!=KeyB.frame)
						t = (frame-KeyA.frame) / (KeyB.frame - KeyA.frame);
					*/

					rotation.slerp(KeyA.rotation, KeyB.rotation, t);
				}
			}
		}
	}
}